

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O1

SampleInfo * __thiscall
Transformed::sampleSurface(SampleInfo *__return_storage_ptr__,Transformed *this,Sampler *sampler)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  vec3f vVar12;
  vec3f vVar13;
  SampleInfo info;
  vec3f local_a8;
  vec3f local_98;
  vec3f local_8c;
  vec3f local_80;
  float local_74;
  mat4f local_70;
  
  (*this->inner->_vptr_Primitive[2])(&local_8c);
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_98.z = 0.0;
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 0.0;
  getLocalBasis(&local_80,&local_98,&local_a8);
  vVar12 = transformedPoint(&this->trans,&local_8c);
  local_70.data[0][0] = (this->invTrans).data[0][0];
  local_70.data[1][0] = (this->invTrans).data[0][1];
  local_70.data[2][0] = (this->invTrans).data[0][2];
  local_70.data[3][0] = (this->invTrans).data[0][3];
  local_70.data[0][1] = (this->invTrans).data[1][0];
  local_70.data[1][1] = (this->invTrans).data[1][1];
  local_70.data[2][1] = (this->invTrans).data[1][2];
  local_70.data[3][1] = (this->invTrans).data[1][3];
  local_70.data[0][2] = (this->invTrans).data[2][0];
  local_70.data[1][2] = (this->invTrans).data[2][1];
  local_70.data[2][2] = (this->invTrans).data[2][2];
  local_70.data[3][2] = (this->invTrans).data[2][3];
  local_70.data[0][3] = (this->invTrans).data[3][0];
  local_70.data[1][3] = (this->invTrans).data[3][1];
  local_70.data[2][3] = (this->invTrans).data[3][2];
  local_70.data[3][3] = (this->invTrans).data[3][3];
  vVar13 = transformedDir(&local_70,&local_80);
  fVar9 = (this->trans).data[0][0];
  fVar5 = (this->trans).data[0][1];
  fVar7 = (this->trans).data[0][2];
  fVar8 = (this->trans).data[1][0];
  fVar10 = (this->trans).data[1][1];
  fVar1 = (this->trans).data[1][2];
  fVar2 = (this->trans).data[2][0];
  fVar3 = (this->trans).data[2][1];
  fVar4 = (this->trans).data[2][2];
  fVar11 = (this->trans).data[0][3] * 0.0;
  fVar6 = fVar7 * local_98.z + fVar9 * local_98.x + local_98.y * fVar5 + fVar11;
  fVar11 = fVar7 * local_a8.z + fVar9 * local_a8.x + fVar5 * local_a8.y + fVar11;
  fVar9 = (this->trans).data[1][3] * 0.0;
  fVar7 = fVar1 * local_98.z + fVar8 * local_98.x + local_98.y * fVar10 + fVar9;
  fVar9 = fVar1 * local_a8.z + fVar8 * local_a8.x + fVar10 * local_a8.y + fVar9;
  fVar10 = (this->trans).data[2][3] * 0.0;
  fVar5 = local_98.z * fVar4 + local_98.x * fVar2 + local_98.y * fVar3 + fVar10;
  fVar10 = fVar4 * local_a8.z + fVar2 * local_a8.x + fVar3 * local_a8.y + fVar10;
  fVar8 = fVar7 * fVar10 - fVar9 * fVar5;
  fVar5 = fVar5 * fVar11 - fVar10 * fVar6;
  fVar9 = fVar9 * fVar6 - fVar11 * fVar7;
  fVar9 = fVar9 * fVar9 + fVar8 * fVar8 + fVar5 * fVar5;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  (__return_storage_ptr__->p).x = (float)(int)vVar12._0_8_;
  (__return_storage_ptr__->p).y = (float)(int)((ulong)vVar12._0_8_ >> 0x20);
  (__return_storage_ptr__->p).z = vVar12.z;
  (__return_storage_ptr__->normal).x = (float)(int)vVar13._0_8_;
  (__return_storage_ptr__->normal).y = (float)(int)((ulong)vVar13._0_8_ >> 0x20);
  (__return_storage_ptr__->normal).z = vVar13.z;
  __return_storage_ptr__->pdf = local_74 / ABS(fVar9);
  return __return_storage_ptr__;
}

Assistant:

SampleInfo sampleSurface(Sampler& sampler) const
	{
		SampleInfo info = inner->sampleSurface(sampler);
		vec3f N1,N2;
		getLocalBasis(info.normal, N1, N2);
		return SampleInfo(transformedPoint(trans, info.p),
			transformedDir(transposed(invTrans), info.normal),
			info.pdf / fabs(norm(cross((trans*vec4f(N1,0)).xyz(), (trans*vec4f(N2,0)).xyz()))));
	}